

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.h
# Opt level: O2

void __thiscall Assimp::ImporterPimpl::ImporterPimpl(ImporterPimpl *this)

{
  _Rb_tree_header *p_Var1;
  
  this->mIOHandler = (IOSystem *)0x0;
  this->mIsDefaultHandler = false;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = false;
  (this->mImporter).
  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mImporter).
  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mImporter).
  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mScene = (aiScene *)0x0;
  (this->mErrorString)._M_dataplus._M_p = (pointer)&(this->mErrorString).field_2;
  (this->mErrorString)._M_string_length = 0;
  (this->mErrorString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->mIntProperties)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mIntProperties)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mIntProperties)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mIntProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mIntProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mIntProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->mIntProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mFloatProperties)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mStringProperties)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mStringProperties)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mStringProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mFloatProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mStringProperties)._M_t._M_impl = 0;
  (this->mStringProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mStringProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->mStringProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMatrixProperties)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mMatrixProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->bExtraVerbose = false;
  this->mPPShared = (SharedPostProcessInfo *)0x0;
  return;
}

Assistant:

inline
ImporterPimpl::ImporterPimpl() AI_NO_EXCEPT
: mIOHandler( nullptr )
, mIsDefaultHandler( false )
, mProgressHandler( nullptr )
, mIsDefaultProgressHandler( false )
, mImporter()
, mPostProcessingSteps()
, mScene( nullptr )
, mErrorString()
, mIntProperties()
, mFloatProperties()
, mStringProperties()
, mMatrixProperties()
, bExtraVerbose( false )
, mPPShared( nullptr ) {
    // empty
}